

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter_inc.h
# Opt level: O3

void SplitByteVectorDistance
               (MemoryManager *m,uint16_t *data,size_t length,size_t literals_per_histogram,
               size_t max_histograms,size_t sampling_stride_length,double block_switch_cost,
               BrotliEncoderParams *params,BlockSplit *split)

{
  int *piVar1;
  byte *pbVar2;
  long *plVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ushort uVar8;
  size_t byte_ix;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  ushort *puVar12;
  void *pvVar13;
  void *pvVar14;
  void *p;
  ulong uVar15;
  HistogramDistance *out;
  uint32_t *cluster_size;
  HistogramDistance *pHVar16;
  uint32_t *__dest;
  uint32_t *puVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  long lVar22;
  uint *puVar23;
  void *pvVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  byte bVar28;
  size_t sVar29;
  long lVar30;
  ulong uVar31;
  size_t sVar32;
  uint *puVar33;
  int iVar37;
  double dVar34;
  undefined1 auVar35 [16];
  int iVar38;
  undefined1 auVar36 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar61;
  int iVar64;
  undefined1 auVar62 [16];
  int iVar65;
  undefined1 auVar63 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar68 [16];
  HistogramDistance *local_d60;
  ulong local_d58;
  uint32_t *local_d50;
  long local_d40;
  ulong local_d20;
  void *local_d10;
  long local_d08;
  HistogramPair *local_cf0;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  HistogramDistance local_8c0;
  
  uVar15 = length / 0x220 + 1;
  if (literals_per_histogram <= length / 0x220) {
    uVar15 = literals_per_histogram;
  }
  if (length == 0) {
    *(undefined8 *)sampling_stride_length = 1;
    return;
  }
  if (length < 0x80) {
    lVar30 = *(long *)(sampling_stride_length + 8);
    uVar25 = *(ulong *)(sampling_stride_length + 0x20);
    uVar15 = lVar30 + 1;
    if (uVar25 < uVar15) {
      if (uVar25 == 0) {
        uVar25 = uVar15;
      }
      do {
        uVar11 = uVar25;
        uVar25 = uVar11 * 2;
      } while (uVar11 < uVar15);
      pvVar9 = BrotliAllocate(m,uVar11);
      if (*(size_t *)(sampling_stride_length + 0x20) != 0) {
        memcpy(pvVar9,*(void **)(sampling_stride_length + 0x10),
               *(size_t *)(sampling_stride_length + 0x20));
      }
      BrotliFree(m,*(void **)(sampling_stride_length + 0x10));
      *(void **)(sampling_stride_length + 0x10) = pvVar9;
      *(ulong *)(sampling_stride_length + 0x20) = uVar11;
      lVar30 = *(long *)(sampling_stride_length + 8);
      uVar15 = lVar30 + 1;
    }
    uVar25 = *(ulong *)(sampling_stride_length + 0x28);
    if (uVar25 < uVar15) {
      if (uVar25 == 0) {
        uVar25 = uVar15;
      }
      do {
        uVar11 = uVar25;
        uVar25 = uVar11 * 2;
      } while (uVar11 < uVar15);
      pvVar9 = BrotliAllocate(m,uVar11 * 4);
      if (*(long *)(sampling_stride_length + 0x28) != 0) {
        memcpy(pvVar9,*(void **)(sampling_stride_length + 0x18),
               *(long *)(sampling_stride_length + 0x28) << 2);
      }
      BrotliFree(m,*(void **)(sampling_stride_length + 0x18));
      *(void **)(sampling_stride_length + 0x18) = pvVar9;
      *(ulong *)(sampling_stride_length + 0x28) = uVar11;
      lVar30 = *(long *)(sampling_stride_length + 8);
    }
    *(undefined8 *)sampling_stride_length = 1;
    *(undefined1 *)(*(long *)(sampling_stride_length + 0x10) + lVar30) = 0;
    lVar30 = *(long *)(sampling_stride_length + 8);
    *(int *)(*(long *)(sampling_stride_length + 0x18) + lVar30 * 4) = (int)length;
    *(long *)(sampling_stride_length + 8) = lVar30 + 1;
    return;
  }
  pvVar10 = BrotliAllocate(m,uVar15 * 0x890);
  lVar22 = uVar15 + (uVar15 == 0);
  pvVar9 = pvVar10;
  lVar30 = lVar22;
  do {
    memset(pvVar9,0,0x888);
    *(undefined8 *)((long)pvVar9 + 0x888) = 0x7ff0000000000000;
    pvVar9 = (void *)((long)pvVar9 + 0x890);
    lVar30 = lVar30 + -1;
  } while (lVar30 != 0);
  lVar30 = 0;
  uVar25 = 7;
  do {
    uVar11 = (lVar30 * length) / uVar15;
    if (lVar30 != 0) {
      uVar25 = (ulong)(uint)((int)uVar25 * 0x41a7);
      uVar11 = uVar11 + uVar25 % (length / uVar15);
    }
    if (length <= uVar11 + 0x28) {
      uVar11 = length - 0x29;
    }
    plVar3 = (long *)((long)pvVar10 + lVar30 * 0x890 + 0x880);
    *plVar3 = *plVar3 + 0x28;
    lVar27 = 0;
    do {
      piVar1 = (int *)((long)pvVar10 + (ulong)data[uVar11 + lVar27] * 4 + lVar30 * 0x890);
      *piVar1 = *piVar1 + 1;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 0x28);
    lVar30 = lVar30 + 1;
  } while (lVar30 != lVar22);
  uVar25 = (length * 2) / 0x28 + uVar15 + 99;
  if (uVar25 != uVar25 % uVar15) {
    uVar31 = 7;
    uVar11 = 0;
    do {
      memset(&local_8c0,0,0x888);
      uVar31 = (ulong)(uint)((int)uVar31 * 0x41a7);
      puVar12 = data + uVar31 % (length - 0x27);
      lVar30 = -0x28;
      do {
        uVar8 = *puVar12;
        puVar12 = puVar12 + 1;
        local_8c0.data_[uVar8] = local_8c0.data_[uVar8] + 1;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 0);
      lVar30 = (uVar11 % uVar15) * 0x890;
      plVar3 = (long *)((long)pvVar10 + lVar30 + 0x880);
      *plVar3 = *plVar3 + 0x28;
      lVar22 = 0;
      do {
        piVar1 = (int *)((long)pvVar10 + lVar22 * 4 + lVar30);
        auVar40._0_4_ = *piVar1 + local_8c0.data_[lVar22];
        auVar40._4_4_ = piVar1[1] + local_8c0.data_[lVar22 + 1];
        auVar40._8_4_ = piVar1[2] + local_8c0.data_[lVar22 + 2];
        auVar40._12_4_ = piVar1[3] + local_8c0.data_[lVar22 + 3];
        *(undefined1 (*) [16])((long)pvVar10 + lVar22 * 4 + lVar30) = auVar40;
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0x220);
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar25 - uVar25 % uVar15);
  }
  pvVar9 = BrotliAllocate(m,length);
  pvVar13 = BrotliAllocate(m,uVar15 * 0x1100);
  pvVar14 = BrotliAllocate(m,uVar15 * 8);
  sVar32 = (uVar15 + 7 >> 3) * length;
  if (sVar32 == 0) {
    local_d10 = (void *)0x0;
  }
  else {
    local_d10 = BrotliAllocate(m,sVar32);
  }
  p = BrotliAllocate(m,uVar15 * 2);
  lVar30 = 3;
  if (10 < *(int *)(max_histograms + 4)) {
    lVar30 = 10;
  }
  lVar22 = 0;
  do {
    if (uVar15 < 2) {
      memset(pvVar9,0,length);
      uVar11 = 1;
      auVar40 = _DAT_0013b170;
    }
    else {
      uVar25 = uVar15 + 7 >> 3;
      memset(pvVar13,0,uVar15 * 0x1100);
      uVar11 = 0;
      puVar23 = (uint *)((long)pvVar10 + 0x880);
      do {
        uVar31 = (ulong)*puVar23;
        if (uVar31 < 0x100) {
          dVar34 = kLog2Table[uVar31];
        }
        else {
          dVar34 = log2((double)uVar31);
        }
        *(double *)((long)pvVar13 + uVar11 * 8) = dVar34;
        uVar11 = uVar11 + 1;
        puVar23 = puVar23 + 0x224;
      } while (uVar15 != uVar11);
      pvVar24 = (void *)(uVar15 * 0x10f8 + (long)pvVar13);
      lVar27 = 0x220;
      puVar23 = (uint *)((long)pvVar10 + 0x87c);
      do {
        lVar27 = lVar27 + -1;
        uVar11 = 0;
        puVar33 = puVar23;
        do {
          dVar39 = -2.0;
          dVar34 = *(double *)((long)pvVar13 + uVar11 * 8);
          uVar31 = (ulong)*puVar33;
          if (uVar31 != 0) {
            if (*puVar33 < 0x100) {
              dVar39 = kLog2Table[uVar31];
            }
            else {
              dVar39 = log2((double)uVar31);
            }
          }
          *(double *)((long)pvVar24 + uVar11 * 8) = dVar34 - dVar39;
          uVar11 = uVar11 + 1;
          puVar33 = puVar33 + 0x224;
        } while (uVar15 != uVar11);
        pvVar24 = (void *)((long)pvVar24 + uVar15 * -8);
        puVar23 = puVar23 + -1;
      } while (lVar27 != 0);
      memset(pvVar14,0,uVar15 * 8);
      memset(local_d10,0,uVar25 * length);
      auVar40 = _DAT_0013b170;
      uVar11 = 0;
      do {
        uVar8 = data[uVar11];
        uVar31 = 0;
        dVar34 = 1e+99;
        do {
          dVar39 = *(double *)((long)pvVar13 + uVar31 * 8 + uVar8 * uVar15 * 8) +
                   *(double *)((long)pvVar14 + uVar31 * 8);
          *(double *)((long)pvVar14 + uVar31 * 8) = dVar39;
          if (dVar39 < dVar34) {
            *(char *)((long)pvVar9 + uVar11) = (char)uVar31;
            dVar34 = dVar39;
          }
          uVar31 = uVar31 + 1;
        } while (uVar15 != uVar31);
        dVar39 = 14.6;
        if (uVar11 < 2000) {
          dVar39 = (((double)(long)uVar11 * 0.07) / 2000.0 + 0.77) * 14.6;
        }
        uVar31 = 0;
        do {
          dVar42 = *(double *)((long)pvVar14 + uVar31 * 8) - dVar34;
          *(double *)((long)pvVar14 + uVar31 * 8) = dVar42;
          if (dVar39 <= dVar42) {
            *(double *)((long)pvVar14 + uVar31 * 8) = dVar39;
            pbVar2 = (byte *)((long)local_d10 + (uVar31 >> 3) + uVar11 * uVar25);
            *pbVar2 = *pbVar2 | '\x01' << ((byte)uVar31 & 7);
          }
          uVar31 = uVar31 + 1;
        } while (uVar15 != uVar31);
        uVar11 = uVar11 + 1;
      } while (uVar11 != length);
      uVar21 = (uint)*(byte *)((long)pvVar9 + (length - 1));
      pvVar24 = (void *)((length - 2) * uVar25 + (long)local_d10);
      uVar11 = 1;
      sVar32 = length;
      do {
        bVar20 = (byte)uVar21;
        if ((*(byte *)((long)pvVar24 + (ulong)(uVar21 >> 3)) >> (uVar21 & 7) & 1) != 0) {
          bVar28 = *(byte *)((long)pvVar9 + (sVar32 - 2));
          uVar21 = (uint)bVar28;
          uVar11 = uVar11 + (bVar20 != bVar28);
        }
        *(char *)((long)pvVar9 + (sVar32 - 2)) = (char)uVar21;
        pvVar24 = (void *)((long)pvVar24 - uVar25);
        sVar32 = sVar32 - 1;
      } while (sVar32 != 1);
    }
    if (uVar15 != 0) {
      lVar27 = uVar15 - 1;
      auVar35._8_4_ = (int)lVar27;
      auVar35._0_8_ = lVar27;
      auVar35._12_4_ = (int)((ulong)lVar27 >> 0x20);
      auVar35 = auVar35 ^ auVar40;
      uVar25 = 0;
      auVar46 = _DAT_0013b0d0;
      auVar43 = _DAT_0013b160;
      auVar44 = _DAT_0013c3d0;
      auVar45 = _DAT_0013c3c0;
      do {
        auVar47 = auVar46 ^ auVar40;
        iVar61 = auVar35._0_4_;
        iVar60 = -(uint)(iVar61 < auVar47._0_4_);
        iVar37 = auVar35._4_4_;
        auVar48._4_4_ = -(uint)(iVar37 < auVar47._4_4_);
        iVar65 = auVar35._8_4_;
        iVar64 = -(uint)(iVar65 < auVar47._8_4_);
        iVar38 = auVar35._12_4_;
        auVar48._12_4_ = -(uint)(iVar38 < auVar47._12_4_);
        auVar57._4_4_ = iVar60;
        auVar57._0_4_ = iVar60;
        auVar57._8_4_ = iVar64;
        auVar57._12_4_ = iVar64;
        auVar66 = pshuflw(in_XMM8,auVar57,0xe8);
        auVar50._4_4_ = -(uint)(auVar47._4_4_ == iVar37);
        auVar50._12_4_ = -(uint)(auVar47._12_4_ == iVar38);
        auVar50._0_4_ = auVar50._4_4_;
        auVar50._8_4_ = auVar50._12_4_;
        auVar68 = pshuflw(in_XMM9,auVar50,0xe8);
        auVar48._0_4_ = auVar48._4_4_;
        auVar48._8_4_ = auVar48._12_4_;
        auVar67 = pshuflw(auVar66,auVar48,0xe8);
        auVar47._8_4_ = 0xffffffff;
        auVar47._0_8_ = 0xffffffffffffffff;
        auVar47._12_4_ = 0xffffffff;
        auVar47 = (auVar67 | auVar68 & auVar66) ^ auVar47;
        auVar47 = packssdw(auVar47,auVar47);
        if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)p + uVar25 * 2) = 0x100;
        }
        auVar48 = auVar50 & auVar57 | auVar48;
        auVar47 = packssdw(auVar48,auVar48);
        auVar67._8_4_ = 0xffffffff;
        auVar67._0_8_ = 0xffffffffffffffff;
        auVar67._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar67,auVar47 ^ auVar67);
        if ((auVar47._0_4_ >> 0x10 & 1) != 0) {
          *(undefined2 *)((long)p + uVar25 * 2 + 2) = 0x100;
        }
        auVar47 = auVar43 ^ auVar40;
        iVar60 = -(uint)(iVar61 < auVar47._0_4_);
        auVar62._4_4_ = -(uint)(iVar37 < auVar47._4_4_);
        iVar64 = -(uint)(iVar65 < auVar47._8_4_);
        auVar62._12_4_ = -(uint)(iVar38 < auVar47._12_4_);
        auVar49._4_4_ = iVar60;
        auVar49._0_4_ = iVar60;
        auVar49._8_4_ = iVar64;
        auVar49._12_4_ = iVar64;
        auVar56._4_4_ = -(uint)(auVar47._4_4_ == iVar37);
        auVar56._12_4_ = -(uint)(auVar47._12_4_ == iVar38);
        auVar56._0_4_ = auVar56._4_4_;
        auVar56._8_4_ = auVar56._12_4_;
        auVar62._0_4_ = auVar62._4_4_;
        auVar62._8_4_ = auVar62._12_4_;
        auVar47 = auVar56 & auVar49 | auVar62;
        auVar47 = packssdw(auVar47,auVar47);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar5,auVar47 ^ auVar5);
        if ((auVar47 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)p + uVar25 * 2 + 4) = 0x100;
        }
        auVar50 = pshufhw(auVar49,auVar49,0x84);
        auVar57 = pshufhw(auVar56,auVar56,0x84);
        auVar48 = pshufhw(auVar50,auVar62,0x84);
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar51 = (auVar48 | auVar57 & auVar50) ^ auVar51;
        auVar50 = packssdw(auVar51,auVar51);
        if ((auVar50 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)p + uVar25 * 2 + 6) = 0x100;
        }
        auVar50 = auVar44 ^ auVar40;
        iVar60 = -(uint)(iVar61 < auVar50._0_4_);
        auVar53._4_4_ = -(uint)(iVar37 < auVar50._4_4_);
        iVar64 = -(uint)(iVar65 < auVar50._8_4_);
        auVar53._12_4_ = -(uint)(iVar38 < auVar50._12_4_);
        auVar58._4_4_ = iVar60;
        auVar58._0_4_ = iVar60;
        auVar58._8_4_ = iVar64;
        auVar58._12_4_ = iVar64;
        auVar47 = pshuflw(auVar47,auVar58,0xe8);
        auVar52._4_4_ = -(uint)(auVar50._4_4_ == iVar37);
        auVar52._12_4_ = -(uint)(auVar50._12_4_ == iVar38);
        auVar52._0_4_ = auVar52._4_4_;
        auVar52._8_4_ = auVar52._12_4_;
        in_XMM9 = pshuflw(auVar68 & auVar66,auVar52,0xe8);
        in_XMM9 = in_XMM9 & auVar47;
        auVar53._0_4_ = auVar53._4_4_;
        auVar53._8_4_ = auVar53._12_4_;
        auVar47 = pshuflw(auVar47,auVar53,0xe8);
        auVar66._8_4_ = 0xffffffff;
        auVar66._0_8_ = 0xffffffffffffffff;
        auVar66._12_4_ = 0xffffffff;
        auVar66 = (auVar47 | in_XMM9) ^ auVar66;
        auVar47 = packssdw(auVar66,auVar66);
        if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)p + uVar25 * 2 + 8) = 0x100;
        }
        auVar53 = auVar52 & auVar58 | auVar53;
        auVar47 = packssdw(auVar53,auVar53);
        auVar68._8_4_ = 0xffffffff;
        auVar68._0_8_ = 0xffffffffffffffff;
        auVar68._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar68,auVar47 ^ auVar68);
        if ((auVar47 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)p + uVar25 * 2 + 10) = 0x100;
        }
        auVar47 = auVar45 ^ auVar40;
        iVar61 = -(uint)(iVar61 < auVar47._0_4_);
        auVar63._4_4_ = -(uint)(iVar37 < auVar47._4_4_);
        iVar65 = -(uint)(iVar65 < auVar47._8_4_);
        auVar63._12_4_ = -(uint)(iVar38 < auVar47._12_4_);
        auVar54._4_4_ = iVar61;
        auVar54._0_4_ = iVar61;
        auVar54._8_4_ = iVar65;
        auVar54._12_4_ = iVar65;
        auVar59._4_4_ = -(uint)(auVar47._4_4_ == iVar37);
        auVar59._12_4_ = -(uint)(auVar47._12_4_ == iVar38);
        auVar59._0_4_ = auVar59._4_4_;
        auVar59._8_4_ = auVar59._12_4_;
        auVar63._0_4_ = auVar63._4_4_;
        auVar63._8_4_ = auVar63._12_4_;
        auVar47 = auVar59 & auVar54 | auVar63;
        auVar47 = packssdw(auVar47,auVar47);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        in_XMM8 = packssdw(auVar47 ^ auVar6,auVar47 ^ auVar6);
        if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)p + uVar25 * 2 + 0xc) = 0x100;
        }
        auVar47 = pshufhw(auVar54,auVar54,0x84);
        auVar48 = pshufhw(auVar59,auVar59,0x84);
        auVar50 = pshufhw(auVar47,auVar63,0x84);
        auVar55._8_4_ = 0xffffffff;
        auVar55._0_8_ = 0xffffffffffffffff;
        auVar55._12_4_ = 0xffffffff;
        auVar55 = (auVar50 | auVar48 & auVar47) ^ auVar55;
        auVar47 = packssdw(auVar55,auVar55);
        if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)p + uVar25 * 2 + 0xe) = 0x100;
        }
        uVar25 = uVar25 + 8;
        lVar27 = auVar46._8_8_;
        auVar46._0_8_ = auVar46._0_8_ + 8;
        auVar46._8_8_ = lVar27 + 8;
        lVar27 = auVar43._8_8_;
        auVar43._0_8_ = auVar43._0_8_ + 8;
        auVar43._8_8_ = lVar27 + 8;
        lVar27 = auVar44._8_8_;
        auVar44._0_8_ = auVar44._0_8_ + 8;
        auVar44._8_8_ = lVar27 + 8;
        lVar27 = auVar45._8_8_;
        auVar45._0_8_ = auVar45._0_8_ + 8;
        auVar45._8_8_ = lVar27 + 8;
      } while ((uVar15 + 7 & 0xfffffffffffffff8) != uVar25);
    }
    sVar32 = 0;
    uVar8 = 0;
    do {
      if (*(short *)((long)p + (ulong)*(byte *)((long)pvVar9 + sVar32) * 2) == 0x100) {
        *(ushort *)((long)p + (ulong)*(byte *)((long)pvVar9 + sVar32) * 2) = uVar8;
        uVar8 = uVar8 + 1;
      }
      sVar32 = sVar32 + 1;
    } while (length != sVar32);
    sVar32 = 0;
    do {
      *(undefined1 *)((long)pvVar9 + sVar32) =
           *(undefined1 *)((long)p + (ulong)*(byte *)((long)pvVar9 + sVar32) * 2);
      sVar32 = sVar32 + 1;
    } while (length != sVar32);
    uVar15 = (ulong)uVar8;
    if (uVar8 != 0) {
      lVar27 = 0;
      do {
        memset((void *)((long)pvVar10 + lVar27),0,0x888);
        *(undefined8 *)((long)pvVar10 + lVar27 + 0x888) = 0x7ff0000000000000;
        lVar27 = lVar27 + 0x890;
      } while (uVar15 * 0x890 != lVar27);
    }
    sVar32 = 0;
    do {
      lVar27 = (ulong)*(byte *)((long)pvVar9 + sVar32) * 0x890;
      piVar1 = (int *)((long)pvVar10 + (ulong)data[sVar32] * 4 + lVar27);
      *piVar1 = *piVar1 + 1;
      plVar3 = (long *)((long)pvVar10 + lVar27 + 0x880);
      *plVar3 = *plVar3 + 1;
      sVar32 = sVar32 + 1;
    } while (length != sVar32);
    lVar22 = lVar22 + 1;
  } while (lVar22 != lVar30);
  BrotliFree(m,pvVar13);
  BrotliFree(m,pvVar14);
  BrotliFree(m,local_d10);
  BrotliFree(m,p);
  BrotliFree(m,pvVar10);
  if (uVar11 == 0) {
    out = (HistogramDistance *)BrotliAllocate(m,0x8070);
    cluster_size = (uint32_t *)BrotliAllocate(m,0x3c);
    local_d20 = 0xf;
    sVar32 = 0;
    pvVar10 = (void *)0x0;
    local_d50 = (uint32_t *)0x0;
    local_d60 = (HistogramDistance *)0x0;
  }
  else {
    sVar32 = uVar11 * 4;
    local_d50 = (uint32_t *)BrotliAllocate(m,sVar32);
    pvVar10 = BrotliAllocate(m,sVar32);
    uVar15 = uVar11 * 0x10 + 0x3f0;
    local_d20 = uVar15 >> 6;
    if (uVar15 < 0x40) {
      cluster_size = (uint32_t *)0x0;
      out = (HistogramDistance *)0x0;
    }
    else {
      out = (HistogramDistance *)BrotliAllocate(m,local_d20 * 0x890);
      cluster_size = (uint32_t *)BrotliAllocate(m,local_d20 * 4);
    }
    uVar15 = 0x40;
    if (uVar11 < 0x40) {
      uVar15 = uVar11;
    }
    local_d60 = (HistogramDistance *)BrotliAllocate(m,uVar15 * 0x890);
  }
  local_cf0 = (HistogramPair *)BrotliAllocate(m,0xc018);
  lVar30 = 0;
  memset(sizes,0,0x100);
  memset(new_clusters,0,0x100);
  memset(symbols,0,0x100);
  memset(remap,0,0x100);
  memset(pvVar10,0,sVar32);
  sVar32 = 0;
  do {
    piVar1 = (int *)((long)pvVar10 + lVar30 * 4);
    *piVar1 = *piVar1 + 1;
    if ((length - 1 == sVar32) ||
       (*(char *)((long)pvVar9 + sVar32) != *(char *)((long)pvVar9 + sVar32 + 1))) {
      lVar30 = lVar30 + 1;
    }
    sVar32 = sVar32 + 1;
  } while (length != sVar32);
  if (uVar11 == 0) {
    local_d58 = 0;
  }
  else {
    local_d08 = 0;
    local_d10 = (void *)0x0;
    uVar31 = 0;
    local_d58 = 0;
    local_d40 = 0;
    uVar15 = uVar11;
    puVar17 = local_d50;
    uVar25 = local_d20;
    do {
      uVar18 = 0x40;
      if (uVar15 < 0x40) {
        uVar18 = uVar15;
      }
      lVar30 = uVar18 + (uVar18 == 0);
      sVar32 = uVar11 - uVar31;
      lVar22 = 0;
      do {
        pHVar16 = local_d60 + lVar22;
        memset(pHVar16,0,0x888);
        local_d60[lVar22].bit_cost_ = INFINITY;
        if (*(int *)((long)pvVar10 + (lVar22 + uVar31) * 4) != 0) {
          uVar18 = 0;
          do {
            pHVar16->data_[data[local_d40 + uVar18]] = pHVar16->data_[data[local_d40 + uVar18]] + 1;
            uVar18 = uVar18 + 1;
          } while (uVar18 < *(uint *)((long)pvVar10 + (lVar22 + uVar31) * 4));
          pHVar16->total_count_ = uVar18;
          local_d40 = local_d40 + uVar18;
        }
        dVar34 = BrotliPopulationCostDistance(pHVar16);
        pHVar16->bit_cost_ = dVar34;
        new_clusters[lVar22] = (uint32_t)lVar22;
        symbols[lVar22] = (uint32_t)lVar22;
        sizes[lVar22] = 1;
        lVar22 = lVar22 + 1;
      } while (lVar22 != lVar30);
      if (0x3f < sVar32) {
        sVar32 = 0x40;
      }
      sVar32 = BrotliHistogramCombineDistance
                         (local_d60,sizes,symbols,new_clusters,local_cf0,sVar32,sVar32,0x40,0x800);
      uVar18 = local_d08 + sVar32;
      if (local_d20 < uVar18) {
        uVar7 = local_d20;
        if (local_d20 == 0) {
          uVar7 = uVar18;
        }
        do {
          uVar19 = uVar7;
          uVar7 = uVar19 * 2;
        } while (uVar19 < uVar18);
        pHVar16 = (HistogramDistance *)BrotliAllocate(m,uVar19 * 0x890);
        if (local_d20 != 0) {
          memcpy(pHVar16,out,local_d20 * 0x890);
        }
        BrotliFree(m,out);
        local_d20 = uVar19;
        out = pHVar16;
      }
      uVar18 = (long)local_d10 + sVar32;
      if (uVar25 < uVar18) {
        uVar7 = uVar25;
        if (uVar25 == 0) {
          uVar7 = uVar18;
        }
        do {
          uVar19 = uVar7;
          uVar7 = uVar19 * 2;
        } while (uVar19 < uVar18);
        __dest = (uint32_t *)BrotliAllocate(m,uVar19 * 4);
        if (uVar25 != 0) {
          memcpy(__dest,cluster_size,uVar25 << 2);
        }
        BrotliFree(m,cluster_size);
        cluster_size = __dest;
        uVar25 = uVar19;
      }
      if (sVar32 != 0) {
        pHVar16 = out + local_d08;
        sVar29 = 0;
        do {
          uVar21 = new_clusters[sVar29];
          memcpy(pHVar16,local_d60 + uVar21,0x890);
          cluster_size[(long)local_d10 + sVar29] = sizes[uVar21];
          remap[new_clusters[sVar29]] = (uint32_t)sVar29;
          sVar29 = sVar29 + 1;
          pHVar16 = pHVar16 + 1;
        } while (sVar32 != sVar29);
        local_d08 = local_d08 + sVar29;
        local_d10 = (void *)((long)local_d10 + sVar29);
      }
      lVar22 = 0;
      do {
        puVar17[lVar22] = remap[symbols[lVar22]] + (int)local_d58;
        lVar22 = lVar22 + 1;
      } while (lVar30 != lVar22);
      local_d58 = local_d58 + sVar32;
      uVar31 = uVar31 + 0x40;
      uVar15 = uVar15 - 0x40;
      puVar17 = puVar17 + 0x40;
    } while (uVar31 < uVar11);
  }
  BrotliFree(m,local_d60);
  uVar15 = (local_d58 >> 1) * local_d58;
  if (local_d58 << 6 < uVar15) {
    uVar15 = local_d58 << 6;
  }
  if (0x800 < uVar15) {
    BrotliFree(m,local_cf0);
    local_cf0 = (HistogramPair *)BrotliAllocate(m,uVar15 * 0x18 + 0x18);
  }
  if (local_d58 == 0) {
    puVar17 = (uint32_t *)0x0;
  }
  else {
    puVar17 = (uint32_t *)BrotliAllocate(m,local_d58 * 4);
    auVar40 = _DAT_0013b170;
    lVar30 = local_d58 - 1;
    auVar36._8_4_ = (int)lVar30;
    auVar36._0_8_ = lVar30;
    auVar36._12_4_ = (int)((ulong)lVar30 >> 0x20);
    uVar25 = 0;
    auVar36 = auVar36 ^ _DAT_0013b170;
    auVar41 = _DAT_0013b0d0;
    do {
      auVar46 = auVar41 ^ auVar40;
      if ((bool)(~(auVar46._4_4_ == auVar36._4_4_ && auVar36._0_4_ < auVar46._0_4_ ||
                  auVar36._4_4_ < auVar46._4_4_) & 1)) {
        puVar17[uVar25] = (uint32_t)uVar25;
      }
      if ((auVar46._12_4_ != auVar36._12_4_ || auVar46._8_4_ <= auVar36._8_4_) &&
          auVar46._12_4_ <= auVar36._12_4_) {
        puVar17[uVar25 + 1] = (uint32_t)uVar25 + 1;
      }
      uVar25 = uVar25 + 2;
      lVar30 = auVar41._8_8_;
      auVar41._0_8_ = auVar41._0_8_ + 2;
      auVar41._8_8_ = lVar30 + 2;
    } while ((local_d58 + 1 & 0xfffffffffffffffe) != uVar25);
  }
  sVar32 = BrotliHistogramCombineDistance
                     (out,cluster_size,local_d50,puVar17,local_cf0,local_d58,uVar11,0x100,uVar15);
  BrotliFree(m,local_cf0);
  BrotliFree(m,cluster_size);
  if (local_d58 == 0) {
    pvVar13 = (void *)0x0;
  }
  else {
    pvVar13 = BrotliAllocate(m,local_d58 << 2);
    memset(pvVar13,0xff,local_d58 << 2);
  }
  if (uVar11 != 0) {
    iVar61 = 0;
    uVar15 = 0;
    local_d40 = 0;
    do {
      memset(&local_8c0,0,0x888);
      local_8c0.bit_cost_ = INFINITY;
      if (*(int *)((long)pvVar10 + uVar15 * 4) != 0) {
        uVar25 = 0;
        do {
          local_8c0.data_[data[local_d40 + uVar25]] = local_8c0.data_[data[local_d40 + uVar25]] + 1;
          uVar25 = uVar25 + 1;
        } while (uVar25 < *(uint *)((long)pvVar10 + uVar15 * 4));
        local_d40 = local_d40 + uVar25;
        local_8c0.total_count_ = uVar25;
      }
      lVar30 = 0;
      if (uVar15 != 0) {
        lVar30 = uVar15 - 1;
      }
      uVar21 = local_d50[lVar30];
      uVar25 = (ulong)uVar21;
      local_d60 = (HistogramDistance *)
                  BrotliHistogramBitCostDistanceDistance(&local_8c0,out + uVar25);
      if (sVar32 != 0) {
        sVar29 = 0;
        do {
          dVar34 = BrotliHistogramBitCostDistanceDistance(&local_8c0,out + puVar17[sVar29]);
          if (dVar34 < (double)local_d60) {
            uVar25 = (ulong)puVar17[sVar29];
            local_d60 = (HistogramDistance *)dVar34;
          }
          uVar21 = (uint)uVar25;
          sVar29 = sVar29 + 1;
        } while (sVar32 != sVar29);
      }
      local_d50[uVar15] = uVar21;
      if (*(int *)((long)pvVar13 + uVar25 * 4) == -1) {
        *(int *)((long)pvVar13 + uVar25 * 4) = iVar61;
        iVar61 = iVar61 + 1;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar11);
  }
  BrotliFree(m,puVar17);
  BrotliFree(m,out);
  uVar15 = *(ulong *)(sampling_stride_length + 0x20);
  if (uVar15 < uVar11) {
    if (uVar15 == 0) {
      uVar15 = uVar11;
    }
    do {
      uVar25 = uVar15;
      uVar15 = uVar25 * 2;
    } while (uVar25 < uVar11);
    pvVar14 = BrotliAllocate(m,uVar25);
    if (*(size_t *)(sampling_stride_length + 0x20) != 0) {
      memcpy(pvVar14,*(void **)(sampling_stride_length + 0x10),
             *(size_t *)(sampling_stride_length + 0x20));
    }
    BrotliFree(m,*(void **)(sampling_stride_length + 0x10));
    *(void **)(sampling_stride_length + 0x10) = pvVar14;
    *(ulong *)(sampling_stride_length + 0x20) = uVar25;
  }
  uVar15 = *(ulong *)(sampling_stride_length + 0x28);
  if (uVar15 < uVar11) {
    if (uVar15 == 0) {
      uVar15 = uVar11;
    }
    do {
      uVar25 = uVar15;
      uVar15 = uVar25 * 2;
    } while (uVar25 < uVar11);
    pvVar14 = BrotliAllocate(m,uVar25 * 4);
    if (*(long *)(sampling_stride_length + 0x28) != 0) {
      memcpy(pvVar14,*(void **)(sampling_stride_length + 0x18),
             *(long *)(sampling_stride_length + 0x28) << 2);
    }
    BrotliFree(m,*(void **)(sampling_stride_length + 0x18));
    *(void **)(sampling_stride_length + 0x18) = pvVar14;
    *(ulong *)(sampling_stride_length + 0x28) = uVar25;
  }
  else if (uVar11 == 0) {
    lVar22 = 1;
    lVar30 = 0;
    goto LAB_0011af66;
  }
  uVar21 = 0;
  lVar30 = 0;
  iVar61 = 0;
  uVar15 = 0;
  do {
    iVar61 = iVar61 + *(int *)((long)pvVar10 + uVar15 * 4);
    if ((uVar11 - 1 == uVar15) || (local_d50[uVar15] != local_d50[uVar15 + 1])) {
      uVar26 = uVar21 & 0xff;
      uVar4 = *(uint *)((long)pvVar13 + (ulong)local_d50[uVar15] * 4);
      bVar28 = (byte)uVar4;
      *(byte *)(*(long *)(sampling_stride_length + 0x10) + lVar30) = bVar28;
      bVar20 = (byte)uVar21;
      uVar21 = uVar4;
      if (bVar28 < bVar20) {
        uVar21 = uVar26;
      }
      *(int *)(*(long *)(sampling_stride_length + 0x18) + lVar30 * 4) = iVar61;
      lVar30 = lVar30 + 1;
      iVar61 = 0;
    }
    uVar15 = uVar15 + 1;
  } while (uVar11 != uVar15);
  lVar22 = (ulong)(uVar21 & 0xff) + 1;
LAB_0011af66:
  *(long *)(sampling_stride_length + 8) = lVar30;
  *(long *)sampling_stride_length = lVar22;
  BrotliFree(m,pvVar13);
  BrotliFree(m,pvVar10);
  BrotliFree(m,local_d50);
  BrotliFree(m,pvVar9);
  return;
}

Assistant:

static void FN(SplitByteVector)(MemoryManager* m,
                                const DataType* data, const size_t length,
                                const size_t literals_per_histogram,
                                const size_t max_histograms,
                                const size_t sampling_stride_length,
                                const double block_switch_cost,
                                const BrotliEncoderParams* params,
                                BlockSplit* split) {
  const size_t data_size = FN(HistogramDataSize)();
  size_t num_histograms = length / literals_per_histogram + 1;
  HistogramType* histograms;
  if (num_histograms > max_histograms) {
    num_histograms = max_histograms;
  }
  if (length == 0) {
    split->num_types = 1;
    return;
  } else if (length < kMinLengthForBlockSplitting) {
    BROTLI_ENSURE_CAPACITY(m, uint8_t,
        split->types, split->types_alloc_size, split->num_blocks + 1);
    BROTLI_ENSURE_CAPACITY(m, uint32_t,
        split->lengths, split->lengths_alloc_size, split->num_blocks + 1);
    if (BROTLI_IS_OOM(m)) return;
    split->num_types = 1;
    split->types[split->num_blocks] = 0;
    split->lengths[split->num_blocks] = (uint32_t)length;
    split->num_blocks++;
    return;
  }
  histograms = BROTLI_ALLOC(m, HistogramType, num_histograms);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(histograms)) return;
  /* Find good entropy codes. */
  FN(InitialEntropyCodes)(data, length,
                          sampling_stride_length,
                          num_histograms, histograms);
  FN(RefineEntropyCodes)(data, length,
                         sampling_stride_length,
                         num_histograms, histograms);
  {
    /* Find a good path through literals with the good entropy codes. */
    uint8_t* block_ids = BROTLI_ALLOC(m, uint8_t, length);
    size_t num_blocks = 0;
    const size_t bitmaplen = (num_histograms + 7) >> 3;
    double* insert_cost = BROTLI_ALLOC(m, double, data_size * num_histograms);
    double* cost = BROTLI_ALLOC(m, double, num_histograms);
    uint8_t* switch_signal = BROTLI_ALLOC(m, uint8_t, length * bitmaplen);
    uint16_t* new_id = BROTLI_ALLOC(m, uint16_t, num_histograms);
    const size_t iters = params->quality < HQ_ZOPFLIFICATION_QUALITY ? 3 : 10;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(block_ids) ||
        BROTLI_IS_NULL(insert_cost) || BROTLI_IS_NULL(cost) ||
        BROTLI_IS_NULL(switch_signal) || BROTLI_IS_NULL(new_id)) {
      return;
    }
    for (i = 0; i < iters; ++i) {
      num_blocks = FN(FindBlocks)(data, length,
                                  block_switch_cost,
                                  num_histograms, histograms,
                                  insert_cost, cost, switch_signal,
                                  block_ids);
      num_histograms = FN(RemapBlockIds)(block_ids, length,
                                         new_id, num_histograms);
      FN(BuildBlockHistograms)(data, length, block_ids,
                               num_histograms, histograms);
    }
    BROTLI_FREE(m, insert_cost);
    BROTLI_FREE(m, cost);
    BROTLI_FREE(m, switch_signal);
    BROTLI_FREE(m, new_id);
    BROTLI_FREE(m, histograms);
    FN(ClusterBlocks)(m, data, length, num_blocks, block_ids, split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, block_ids);
  }
}